

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::additiveExpr(Parser *this,TokIter *iter,TokIter end)

{
  _Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
  *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ast::Expression> sVar2;
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_80;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_68;
  undefined8 uStack_60;
  initializer_list<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_> local_58;
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_48.mp.
  super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)multiplicativeExpr;
  local_48.mp.
  super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_array = &local_68;
  local_68.first = Plus;
  local_68.second = Add;
  uStack_60 = 0xf0000001c;
  local_58._M_len = 2;
  local_48.mp.
  super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iter;
  SmallMap<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>::SmallMap(&local_80,&local_58);
  sVar2 = auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                    (this,iter,end,in_RCX,&local_48);
  _Var1 = sVar2.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_80.mp.
      super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.mp.
                    super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.mp.
                          super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.mp.
                          super__Vector_base<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>,_std::allocator<std::pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar2.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::additiveExpr(TokIter &iter,
                                                      TokIter end) {
  namespace ph = std::placeholders;
  return auxBinaryExpr(
      iter, end, std::bind(&Parser::multiplicativeExpr, this, ph::_1, ph::_2),
      {{TokenID::Plus, ast::BinaryExpr::Add},
       {TokenID::Minus, ast::BinaryExpr::Sub}});
}